

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

sunrealtype LBasis(ARKInterp I,int j,sunrealtype t)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar2 = *(uint *)((long)I->content + 0x18);
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  dVar6 = 1.0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if ((uint)j != uVar5) {
      lVar3 = *(long *)((long)I->content + 0x10);
      dVar1 = *(double *)(lVar3 + uVar5 * 8);
      dVar6 = dVar6 * ((t - dVar1) / (*(double *)(lVar3 + (long)j * 8) - dVar1));
    }
  }
  return dVar6;
}

Assistant:

sunrealtype LBasis(ARKInterp I, int j, sunrealtype t)
{
  int k;
  sunrealtype p = ONE;
  for (k = 0; k < LINT_NHIST(I); k++)
  {
    if (k == j) { continue; }
    p *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
  }
  return (p);
}